

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

double Catch::Benchmark::Detail::mean(const_iterator first,const_iterator last)

{
  const_iterator cVar1;
  double dVar2;
  
  dVar2 = 0.0;
  for (cVar1._M_current = first._M_current; cVar1._M_current != last._M_current;
      cVar1._M_current = cVar1._M_current + 1) {
    dVar2 = dVar2 + *cVar1._M_current;
  }
  return dVar2 / (double)((long)last._M_current - (long)first._M_current >> 3);
}

Assistant:

double mean( std::vector<double>::const_iterator first,
                         std::vector<double>::const_iterator last ) {
                auto count = last - first;
                double sum = 0.;
                while (first != last) {
                    sum += *first;
                    ++first;
                }
                return sum / static_cast<double>(count);
            }